

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_game.cpp
# Opt level: O3

void __thiscall cpp_client::Base_game::set_ai_parameters(Base_game *this,string *params)

{
  Base_ai *pBVar1;
  _Alloc_hider _Var2;
  long lVar3;
  long lVar4;
  mapped_type *pmVar5;
  runtime_error *prVar6;
  long *plVar7;
  size_type *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> to_parse;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  key_type local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Base_game *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(this->super_Delta_mergable)._vptr_Delta_mergable[0xb])(&local_b8,this);
  _Var2._M_p = local_b8._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  pBVar1 = (this->ai_)._M_t.
           super___uniq_ptr_impl<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>.
           _M_t.
           super__Tuple_impl<0UL,_cpp_client::Base_ai_*,_std::default_delete<cpp_client::Base_ai>_>.
           super__Head_base<0UL,_cpp_client::Base_ai_*,_false>._M_head_impl;
  (this->ai_)._M_t.
  super___uniq_ptr_impl<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>._M_t.
  super__Tuple_impl<0UL,_cpp_client::Base_ai_*,_std::default_delete<cpp_client::Base_ai>_>.
  super__Head_base<0UL,_cpp_client::Base_ai_*,_false>._M_head_impl = (Base_ai *)_Var2._M_p;
  local_78 = this;
  if (pBVar1 != (Base_ai *)0x0) {
    (*pBVar1->_vptr_Base_ai[7])();
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 0x38))();
    }
  }
  if (params->_M_string_length != 0) {
    if (*(params->_M_dataplus)._M_p == '&') {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_b8,"Can not begin AI settings string with &, string was:\n",params);
      std::runtime_error::runtime_error(prVar6,(string *)&local_b8);
      *(undefined ***)prVar6 = &PTR__runtime_error_001391b8;
      __cxa_throw(prVar6,&Input_error::typeinfo,std::runtime_error::~runtime_error);
    }
    do {
      lVar3 = std::__cxx11::string::find((char)params,0x26);
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)params);
      lVar4 = std::__cxx11::string::find((char)&local_b8,0x3d);
      if (lVar4 == -1) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"Could not parse the AI settings string:\n",params);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_70._M_dataplus._M_p == psVar8) {
          local_70.field_2._M_allocated_capacity = *psVar8;
          local_70.field_2._8_8_ = plVar7[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar8;
        }
        local_70._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::operator+(&local_98,&local_70,&local_b8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_d8._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_d8._M_dataplus._M_p == psVar8) {
          local_d8.field_2._M_allocated_capacity = *psVar8;
          local_d8.field_2._8_8_ = plVar7[3];
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar8;
        }
        local_d8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::runtime_error::runtime_error(prVar6,(string *)&local_d8);
        *(undefined ***)prVar6 = &PTR__runtime_error_001391b8;
        __cxa_throw(prVar6,&Input_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_b8);
      std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_b8);
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&((local_78->ai_)._M_t.
                                 super___uniq_ptr_impl<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cpp_client::Base_ai_*,_std::default_delete<cpp_client::Base_ai>_>
                                 .super__Head_base<0UL,_cpp_client::Base_ai_*,_false>._M_head_impl)
                                ->passed_params_,&local_d8);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
    } while (lVar3 != -1);
  }
  return;
}

Assistant:

void Base_game::set_ai_parameters(const std::string& params)
{
   ai_ = generate_ai();
   // this simplifies code a lot
   if(params.empty())
   {
      return;
   }
   // error on leading ampersands
   if(params[0] == '&')
   {
      throw Input_error("Can not begin AI settings string with &, string was:\n" +
                        params);
   }
   auto split = 0;
   while(true)
   {
      const auto new_split = params.find('&', split + 1);
      const auto to_parse = params.substr(split, new_split - split);
      const auto eq_loc = to_parse.find('=');
      if(eq_loc == params.npos)
      {
         throw Input_error("Could not parse the AI settings string:\n" +
                           params + "\n"
                           "In particular, could not find '=' in \"" + to_parse + "\"");
      }
      const auto key = to_parse.substr(0, eq_loc);
      const auto value = to_parse.substr(eq_loc + 1, std::string::npos);
      ai_->passed_params_[key] = value;
      if(new_split == std::string::npos)
      {
         break;
      }
      split = new_split + 1;
   }
}